

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

void count_suite::count_full(void)

{
  ulong uVar1;
  ulong uVar2;
  initializer_list<int> input;
  basic_iterator<int> __first;
  basic_iterator<int> __first_00;
  basic_iterator<int> __last;
  basic_iterator<int> __last_00;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  undefined4 local_70;
  undefined4 local_6c;
  difference_type local_68 [2];
  undefined4 local_58;
  circular_view<int,_18446744073709551615UL> local_48;
  type local_28 [6];
  
  local_48.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_48.member.cap = 4;
  local_48.member.size = 0;
  local_48.member.next = 4;
  local_68[0] = 0x160000000b;
  local_68[1] = 0x2c00000021;
  local_58 = 0x37;
  input._M_len = 5;
  input._M_array = (iterator)local_68;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_48,input);
  uVar1 = local_48.member.cap * 2;
  if ((uVar1 & local_48.member.cap * 2 - 1) == 0) {
    uVar2 = local_48.member.next - local_48.member.size & uVar1 - 1;
    uVar1 = uVar1 - 1 & local_48.member.next;
  }
  else {
    uVar2 = (local_48.member.next - local_48.member.size) % uVar1;
    uVar1 = local_48.member.next % uVar1;
  }
  local_6c = 0xb;
  __first.current = uVar2;
  __first.parent = &local_48;
  __last.current = uVar1;
  __last.parent = &local_48;
  local_68[0] = std::
                __count_if<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (__first,__last,(_Iter_equals_val<const_int>)&local_6c);
  local_70 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(span.begin(), span.end(), 11)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xe8,"void count_suite::count_full()",local_68,&local_70);
  uVar1 = local_48.member.cap * 2;
  if ((uVar1 & local_48.member.cap * 2 - 1) == 0) {
    uVar2 = local_48.member.next - local_48.member.size & uVar1 - 1;
    uVar1 = uVar1 - 1 & local_48.member.next;
  }
  else {
    uVar2 = (local_48.member.next - local_48.member.size) % uVar1;
    uVar1 = local_48.member.next % uVar1;
  }
  local_6c = 0x16;
  __first_00.current = uVar2;
  __first_00.parent = &local_48;
  __last_00.current = uVar1;
  __last_00.parent = &local_48;
  local_68[0] = std::
                __count_if<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (__first_00,__last_00,(_Iter_equals_val<const_int>)&local_6c);
  local_70 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(span.begin(), span.end(), 22)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xe9,"void count_suite::count_full()",local_68,&local_70);
  return;
}

Assistant:

void count_full()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    BOOST_TEST_EQ(std::count(span.begin(), span.end(), 11), 0);
    BOOST_TEST_EQ(std::count(span.begin(), span.end(), 22), 1);
}